

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<unsigned_int,QString>::emplace<QString_const&>
          (QHash<unsigned_int,_QString> *this,uint *key,QString *args)

{
  long lVar1;
  bool bVar2;
  uint *in_RSI;
  QHash<unsigned_int,_QString> *in_RDI;
  long in_FS_OFFSET;
  QHash<unsigned_int,_QString> copy;
  QString *in_stack_ffffffffffffff88;
  QString *in_stack_ffffffffffffff90;
  QString *in_stack_ffffffffffffff98;
  uint *in_stack_ffffffffffffffa0;
  piter local_38;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QHash<unsigned_int,_QString>::isDetached
                    ((QHash<unsigned_int,_QString> *)in_stack_ffffffffffffff90);
  if (bVar2) {
    bVar2 = QHashPrivate::Data<QHashPrivate::Node<unsigned_int,_QString>_>::shouldGrow(in_RDI->d);
    if (bVar2) {
      QString::QString(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      local_38 = (piter)QHash<unsigned_int,_QString>::emplace_helper<QString>
                                  (in_RDI,in_RSI,in_stack_ffffffffffffff98);
      QString::~QString((QString *)0x166e1e);
    }
    else {
      local_38 = (piter)emplace_helper<QString_const&>
                                  (in_RDI,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
  }
  else {
    QHash<unsigned_int,_QString>::QHash
              ((QHash<unsigned_int,_QString> *)in_stack_ffffffffffffff90,
               (QHash<unsigned_int,_QString> *)in_stack_ffffffffffffff88);
    QHash<unsigned_int,_QString>::detach((QHash<unsigned_int,_QString> *)in_stack_ffffffffffffff90);
    local_38 = (piter)emplace_helper<QString_const&>
                                (in_RDI,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    QHash<unsigned_int,_QString>::~QHash((QHash<unsigned_int,_QString> *)in_stack_ffffffffffffff90);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (iterator)local_38;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }